

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_relation.cpp
# Opt level: O0

void __thiscall
duckdb::FilterRelation::FilterRelation
          (FilterRelation *this,shared_ptr<duckdb::Relation,_true> *child_p,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *condition_p)

{
  shared_ptr<duckdb::ClientContextWrapper,_true> *in_RDX;
  string *in_RSI;
  Relation *in_RDI;
  vector<duckdb::ColumnDefinition,_true> dummy_columns;
  vector<duckdb::ColumnDefinition,_true> *in_stack_ffffffffffffff48;
  shared_ptr<duckdb::Relation,_true> *in_stack_ffffffffffffff50;
  Relation *this_00;
  string *psVar1;
  RelationType type;
  undefined1 local_68 [48];
  string local_38 [56];
  
  psVar1 = in_RSI;
  shared_ptr<duckdb::Relation,_true>::operator->(in_stack_ffffffffffffff50);
  type = (RelationType)((ulong)psVar1 >> 0x38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,anon_var_dwarf_3eb64fd + 9,(allocator *)(local_68 + 0x2f))
  ;
  Relation::Relation(in_RDI,in_RDX,type,in_RSI);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)(local_68 + 0x2f));
  in_RDI->_vptr_Relation = (_func_int **)&PTR__FilterRelation_03532cb8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>::
  unique_ptr((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffff50,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)in_stack_ffffffffffffff48);
  shared_ptr<duckdb::Relation,_true>::shared_ptr
            (in_stack_ffffffffffffff50,
             (shared_ptr<duckdb::Relation,_true> *)in_stack_ffffffffffffff48);
  this_00 = (Relation *)local_68;
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x19556ef);
  Relation::TryBindRelation(this_00,in_stack_ffffffffffffff48);
  vector<duckdb::ColumnDefinition,_true>::~vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x195570a);
  return;
}

Assistant:

FilterRelation::FilterRelation(shared_ptr<Relation> child_p, unique_ptr<ParsedExpression> condition_p)
    : Relation(child_p->context, RelationType::FILTER_RELATION), condition(std::move(condition_p)),
      child(std::move(child_p)) {
	D_ASSERT(child.get() != this);
	vector<ColumnDefinition> dummy_columns;
	TryBindRelation(dummy_columns);
}